

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AY38910.cpp
# Opt level: O0

void __thiscall GI::AY38910::AY38910SampleSource<true>::update_bus(AY38910SampleSource<true> *this)

{
  ControlState CVar1;
  uint8_t uVar2;
  AY38910SampleSource<true> *this_local;
  
  this->data_output_ = 0xff;
  CVar1 = this->control_state_;
  if (CVar1 == LatchAddress) {
    select_register(this,this->data_input_);
  }
  else if (CVar1 == Read) {
    uVar2 = get_register_value(this);
    this->data_output_ = uVar2;
  }
  else if (CVar1 == Write) {
    set_register_value(this,this->data_input_);
  }
  return;
}

Assistant:

void AY38910SampleSource<is_stereo>::update_bus() {
	// Assume no output, unless this turns out to be a read.
	data_output_ = 0xff;
	switch(control_state_) {
		default:			break;
		case LatchAddress:	select_register(data_input_);			break;
		case Write:			set_register_value(data_input_);		break;
		case Read:			data_output_ = get_register_value();	break;
	}
}